

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O3

void tcg_reg_alloc_do_movi
               (TCGContext_conflict9 *s,TCGTemp *ots,tcg_target_ulong val,TCGLifeData arg_life,
               TCGRegSet preferred_regs)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = *(ulong *)ots;
  if (((uint)uVar2 & 0xff00) == 0x100) {
    s->reg_to_temp[uVar2 & 0xff] = (TCGTemp *)0x0;
    uVar2 = *(ulong *)ots;
  }
  ots->val = val;
  *(ulong *)ots = uVar2 & 0xfffffff7ffff00ff | 0x300;
  if ((arg_life & 1) == 0) {
    if (((uVar2 & 0x100000000) == 0 & (byte)arg_life >> 2) == 1) {
      uVar1 = uVar2 >> 0x1c & 0x200;
      if ((uVar2 >> 0x26 & 1) != 0) {
        uVar1 = 0x200;
      }
      *(ulong *)ots = uVar2 & 0xfffffff6ffff00ff | uVar1;
    }
    return;
  }
  temp_sync(s,ots,s->reserved_regs,preferred_regs,arg_life & 4);
  return;
}

Assistant:

static void tcg_reg_alloc_do_movi(TCGContext *s, TCGTemp *ots,
                                  tcg_target_ulong val, TCGLifeData arg_life,
                                  TCGRegSet preferred_regs)
{
    /* ENV should not be modified.  */
    tcg_debug_assert(!ots->fixed_reg);

    /* The movi is not explicitly generated here.  */
    if (ots->val_type == TEMP_VAL_REG) {
        s->reg_to_temp[ots->reg] = NULL;
    }
    ots->val_type = TEMP_VAL_CONST;
    ots->val = val;
    ots->mem_coherent = 0;
    if (NEED_SYNC_ARG(0)) {
        temp_sync(s, ots, s->reserved_regs, preferred_regs, IS_DEAD_ARG(0));
    } else if (IS_DEAD_ARG(0)) {
        temp_dead(s, ots);
    }
}